

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap(MessageGenerator *this,Printer *p)

{
  unsigned_long uVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  undefined8 uVar2;
  bool bVar3;
  undefined1 split;
  int iVar4;
  int iVar5;
  FileDescriptor *file;
  MaybeInitializedPtr MVar6;
  FieldDescriptor *pFVar7;
  reference ppFVar8;
  pointer ppVar9;
  FieldGenerator *this_00;
  size_t sVar10;
  unsigned_long uVar11;
  const_iterator cVar12;
  Iterator IVar13;
  string_view sVar14;
  Sub *local_440;
  unsigned_long local_388;
  size_t i_3;
  undefined1 auStack_378 [4];
  int i_2;
  char *local_370;
  value_type local_368;
  value_type oneof;
  Iterator __end4;
  Iterator __begin4;
  OneOfRangeImpl *__range4;
  string local_328;
  allocator<char> local_301;
  string local_300;
  Sub *local_2e0;
  Sub local_2d8;
  Sub local_220;
  iterator local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_158;
  undefined1 local_148 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  string last_field_name;
  string first_field_name;
  size_t run_length;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  const_iterator it;
  FieldDescriptor *field;
  size_t i_1;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> local_b0;
  undefined1 local_90 [8];
  RunMap runs;
  size_t i;
  basic_string_view<char,_std::char_traits<char>_> local_60 [2];
  undefined1 local_40 [8];
  Formatter format;
  Printer *p_local;
  MessageGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)p;
  bVar3 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar3) {
    Formatter::Formatter
              ((Formatter *)local_40,
               (Printer *)
               format.vars_.
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.slot_array);
    Formatter::operator()<>
              ((Formatter *)local_40,
               "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT $nonnull$ other) {\n")
    ;
    Formatter::Indent((Formatter *)local_40);
    Formatter::operator()<>((Formatter *)local_40,"using ::std::swap;\n");
    Formatter::operator()<>((Formatter *)local_40,"$WeakDescriptorSelfPin$");
    file = Descriptor::file(this->descriptor_);
    bVar3 = HasGeneratedMethods(file,&this->options_);
    if (bVar3) {
      iVar4 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar4) {
        Formatter::operator()<>
                  ((Formatter *)local_40,"$extensions$.InternalSwap(&other->$extensions$);\n");
      }
      bVar3 = cpp::anon_unknown_0::HasNonSplitOptionalString(this->descriptor_,&this->options_);
      uVar2 = format.vars_.
              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_60,
                   "\n        auto* arena = GetArena();\n        ABSL_DCHECK_EQ(arena, other->GetArena());\n      "
                  );
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar2,local_60[0]._M_len,local_60[0]._M_str);
      }
      Formatter::operator()<>
                ((Formatter *)local_40,
                 "_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");
      bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
      if (!bVar3) {
        for (runs.
             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
             .
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
             .settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
            uVar2 = runs.
                    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                    .
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.slot_array,
            MVar6 = (MaybeInitializedPtr)HasBitsSize(this), (ulong)uVar2 < MVar6.p;
            runs.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array =
                 (MaybeInitializedPtr)
                 ((long)runs.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.slot_array + 1)) {
          Formatter::operator()
                    ((Formatter *)local_40,"swap($has_bits$[$1$], other->$has_bits$[$1$]);\n",
                     (unsigned_long *)
                     ((long)&runs.
                             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                             .
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value + 0x18));
        }
      }
      i_1 = (size_t)this;
      std::function<bool(google::protobuf::FieldDescriptor_const*)>::
      function<google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap(google::protobuf::io::Printer*)::__0,void>
                ((function<bool(google::protobuf::FieldDescriptor_const*)> *)&local_b0,
                 (anon_class_8_1_8991fb9c *)&i_1);
      cpp::anon_unknown_0::FindRuns((RunMap *)local_90,&this->optimized_order_,&local_b0);
      std::function<bool_(const_google::protobuf::FieldDescriptor_*)>::~function(&local_b0);
      for (field = (FieldDescriptor *)0x0;
          pFVar7 = (FieldDescriptor *)
                   std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::size(&this->optimized_order_), field < pFVar7;
          field = (FieldDescriptor *)&field->field_0x1) {
        ppFVar8 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(size_type)field);
        it.inner_.field_1.slot_ = (slot_type *)*ppFVar8;
        bVar3 = ShouldSplit((FieldDescriptor *)it.inner_.field_1.slot_,&this->options_);
        if (!bVar3) {
          cVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                   ::find<google::protobuf::FieldDescriptor_const*>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                               *)local_90,
                              (key_arg<const_google::protobuf::FieldDescriptor_*> *)
                              &it.inner_.field_1.slot_);
          it.inner_.ctrl_ = (ctrl_t *)cVar12.inner_.field_1;
          local_d8 = (undefined1  [8])cVar12.inner_.ctrl_;
          cVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                   ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                          *)local_90);
          local_e0 = cVar12.inner_.field_1;
          run_length = (size_t)cVar12.inner_.ctrl_;
          split = absl::lts_20250127::container_internal::operator!=
                            ((const_iterator *)local_d8,(const_iterator *)&run_length);
          bVar3 = false;
          if ((bool)split) {
            ppVar9 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                     ::const_iterator::operator->((const_iterator *)local_d8);
            bVar3 = 1 < ppVar9->second;
          }
          if (bVar3) {
            ppVar9 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                     ::const_iterator::operator->((const_iterator *)local_d8);
            uVar1 = ppVar9->second;
            FieldMemberName_abi_cxx11_
                      ((string *)((long)&last_field_name.field_2 + 8),(cpp *)it.inner_.field_1.slot_
                       ,(FieldDescriptor *)0x0,(bool)split);
            uVar11 = uVar1;
            ppFVar8 = std::
                      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ::operator[](&this->optimized_order_,(long)field + (uVar1 - 1));
            FieldMemberName_abi_cxx11_
                      ((string *)(v.storage_.callback_buffer_ + 8),(cpp *)*ppFVar8,
                       (FieldDescriptor *)0x0,SUB81(uVar11,0));
            uVar2 = format.vars_.
                    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.slot_array;
            __range4._6_1_ = 1;
            local_2e0 = &local_2d8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_300,"first",&local_301);
            io::Printer::Sub::Sub<std::__cxx11::string_const&>
                      (&local_2d8,&local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&last_field_name.field_2 + 8));
            local_2e0 = &local_220;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_328,"last",(allocator<char> *)((long)&__range4 + 7));
            io::Printer::Sub::Sub<std::__cxx11::string_const&>
                      (&local_220,&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (v.storage_.callback_buffer_ + 8));
            __range4._6_1_ = 0;
            local_168 = &local_2d8;
            local_160 = 2;
            v_00._M_len = 2;
            v_00._M_array = local_168;
            absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
            Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                      ((Span<google::protobuf::io::Printer::Sub_const> *)local_158._M_local_buf,v_00
                      );
            io::Printer::WithVars
                      ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                        *)local_148,(Printer *)uVar2,
                       (Span<const_google::protobuf::io::Printer::Sub>)local_158);
            local_440 = (Sub *)&local_168;
            do {
              local_440 = local_440 + -1;
              io::Printer::Sub::~Sub(local_440);
            } while (local_440 != &local_2d8);
            std::__cxx11::string::~string((string *)&local_328);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
            std::__cxx11::string::~string((string *)&local_300);
            std::allocator<char>::~allocator(&local_301);
            Formatter::operator()<>
                      ((Formatter *)local_40,
                       "$pbi$::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n    + sizeof($classname$::$last$)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n        reinterpret_cast<char*>(&$first$),\n        reinterpret_cast<char*>(&other->$first$));\n"
                      );
            field = (FieldDescriptor *)((uVar1 - 1) + (long)field);
            absl::lts_20250127::
            Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
            ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                        *)local_148);
            std::__cxx11::string::~string((string *)(v.storage_.callback_buffer_ + 8));
            std::__cxx11::string::~string((string *)(last_field_name.field_2._M_local_buf + 8));
          }
          else {
            this_00 = FieldGeneratorTable::get
                                (&this->field_generators_,(FieldDescriptor *)it.inner_.field_1.slot_
                                );
            FieldGenerator::GenerateSwappingCode
                      (this_00,(Printer *)
                               format.vars_.
                               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_.heap.slot_array);
          }
        }
      }
      bVar3 = ShouldSplit(this->descriptor_,&this->options_);
      if (bVar3) {
        Formatter::operator()<>((Formatter *)local_40,"swap($split$, other->$split$);\n");
      }
      __begin4.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
      IVar13 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin4.descriptor);
      __begin4._0_8_ = IVar13.descriptor;
      __end4.descriptor._0_4_ = IVar13.idx;
      IVar13 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin4.descriptor);
      __end4._0_8_ = IVar13.descriptor;
      oneof._0_4_ = IVar13.idx;
      while( true ) {
        bVar3 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&oneof);
        if (!bVar3) break;
        local_368 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end4.descriptor);
        sVar14 = OneofDescriptor::name(local_368);
        _auStack_378 = sVar14;
        Formatter::operator()
                  ((Formatter *)local_40,"swap(_impl_.$1$_, other->_impl_.$1$_);\n",
                   (basic_string_view<char,_std::char_traits<char>_> *)auStack_378);
        OneOfRangeImpl::Iterator::operator++((Iterator *)&__end4.descriptor);
      }
      i_3._4_4_ = 0;
      while( true ) {
        iVar4 = i_3._4_4_;
        iVar5 = Descriptor::real_oneof_decl_count(this->descriptor_);
        if (iVar5 <= iVar4) break;
        Formatter::operator()
                  ((Formatter *)local_40,"swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n",
                   (int *)((long)&i_3 + 4));
        i_3._4_4_ = i_3._4_4_ + 1;
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)local_40,
                   "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$);\n");
      }
      bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
      if (!bVar3) {
        local_388 = 0;
        while( true ) {
          uVar1 = local_388;
          sVar10 = InlinedStringDonatedSize(this);
          if (sVar10 <= uVar1) break;
          Formatter::operator()
                    ((Formatter *)local_40,
                     "swap($inlined_string_donated_array$[$1$], other->$inlined_string_donated_array$[$1$]);\n"
                     ,&local_388);
          local_388 = local_388 + 1;
        }
      }
      absl::lts_20250127::
      flat_hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
      ::~flat_hash_map((flat_hash_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                        *)local_90);
    }
    else {
      Formatter::operator()<>((Formatter *)local_40,"GetReflection()->Swap(this, other);");
    }
    Formatter::Outdent((Formatter *)local_40);
    Formatter::operator()<>((Formatter *)local_40,"}\n");
    Formatter::~Formatter((Formatter *)local_40);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  format(
      "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT "
      "$nonnull$ other) {\n");
  format.Indent();
  format("using ::std::swap;\n");
  format("$WeakDescriptorSelfPin$");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format(
          "$extensions$.InternalSwap(&other->$extensions$);"
          "\n");
    }

    if (HasNonSplitOptionalString(descriptor_, options_)) {
      p->Emit(R"cc(
        auto* arena = GetArena();
        ABSL_DCHECK_EQ(arena, other->GetArena());
      )cc");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (size_t i = 0; i < HasBitsSize(); ++i) {
        format("swap($has_bits$[$1$], other->$has_bits$[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return !ShouldSplit(field, options_) &&
                 HasTrivialSwap(field, options_, scc_analyzer_);
        });

    for (size_t i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      if (ShouldSplit(field, options_)) {
        continue;
      }
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name =
            FieldMemberName(field, /*split=*/false);
        const std::string last_field_name = FieldMemberName(
            optimized_order_[i + run_length - 1], /*split=*/false);

        auto v = p->WithVars({
            {"first", first_field_name},
            {"last", last_field_name},
        });

        format(
            "$pbi$::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n"
            "    + sizeof($classname$::$last$)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n"
            "        reinterpret_cast<char*>(&$first$),\n"
            "        reinterpret_cast<char*>(&other->$first$));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(p);
      }
    }
    if (ShouldSplit(descriptor_, options_)) {
      format("swap($split$, other->$split$);\n");
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap(_impl_.$1$_, other->_impl_.$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
      format("swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format(
          "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$)"
          ";\n");
    }

    if (!inlined_string_indices_.empty()) {
      for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
        format(
            "swap($inlined_string_donated_array$[$1$], "
            "other->$inlined_string_donated_array$[$1$]);\n",
            i);
      }
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}